

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::Step(Thread *this,Ptr *out_trap)

{
  Store *store;
  RunResult RVar1;
  reference pvVar2;
  undefined1 local_30 [8];
  Ptr func;
  Ptr *out_trap_local;
  Thread *this_local;
  
  store = this->store_;
  func.root_index_ = (Index)out_trap;
  pvVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                     (&this->frames_);
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)local_30,store,(Ref)(pvVar2->func).index);
  RVar1 = StepInternal(this,(Ptr *)func.root_index_);
  RefPtr<wabt::interp::DefinedFunc>::~RefPtr((RefPtr<wabt::interp::DefinedFunc> *)local_30);
  return RVar1;
}

Assistant:

RunResult Thread::Step(Trap::Ptr* out_trap) {
  DefinedFunc::Ptr func{store_, frames_.back().func};
  return StepInternal(out_trap);
}